

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

size_t __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::erase(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this,key_type *key)

{
  __type _Var1;
  uint8_t *puVar2;
  uint uVar3;
  InfoType info;
  size_t idx;
  
  idx = 0;
  info = 0;
  Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  ::keyToIdx<std::__cxx11::string_const&>
            ((Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              *)this,key,&idx,&info);
  puVar2 = this->mInfo;
  uVar3 = (uint)puVar2[idx];
  do {
    if (info == uVar3) {
      _Var1 = std::operator==(key,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(this->mKeyVals + idx));
      if (_Var1) {
        shiftDown(this,idx);
        this->mNumElements = this->mNumElements - 1;
        return 1;
      }
      puVar2 = this->mInfo;
    }
    info = info + this->mInfoInc;
    uVar3 = (uint)puVar2[idx + 1];
    idx = idx + 1;
  } while (info <= uVar3);
  return 0;
}

Assistant:

size_t erase(const key_type& key) {
        ROBIN_HOOD_TRACE(this)
        size_t idx{};
        InfoType info{};
        keyToIdx(key, &idx, &info);

        // check while info matches with the source idx
        do {
            if (info == mInfo[idx] && WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                shiftDown(idx);
                --mNumElements;
                return 1;
            }
            next(&info, &idx);
        } while (info <= mInfo[idx]);

        // nothing found to delete
        return 0;
    }